

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O2

void __thiscall OctreeBuilder::create_pipeline(OctreeBuilder *this,shared_ptr<myvk::Device> *device)

{
  shared_ptr<myvk::PipelineLayout> *this_00;
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  VkSpecializationInfo spec_info;
  VkSpecializationMapEntry spec_entries [2];
  shared_ptr<myvk::ShaderModule> octree_tag_node_shader_module;
  undefined1 local_da0 [24];
  uint32_t kOctreeTagNodeCompSpv [856];
  
  std::__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2> *)
             &octree_tag_node_shader_module,
             &(this->m_descriptor_set_layout).
              super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 1;
  __l._M_array = (iterator)&octree_tag_node_shader_module;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)kOctreeTagNodeCompSpv,__l,(allocator_type *)local_da0);
  spec_entries[0].constantID = 0;
  spec_entries[0].offset = 0;
  spec_entries[0].size = 0;
  spec_entries[1].constantID = 0;
  spec_entries[1].offset = 0;
  myvk::PipelineLayout::Create
            ((PipelineLayout *)&spec_info,device,
             (vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
              *)kOctreeTagNodeCompSpv,
             (vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)spec_entries);
  this_00 = &this->m_pipeline_layout;
  std::__shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2> *)&spec_info);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spec_info.pMapEntries);
  std::_Vector_base<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::~_Vector_base
            ((_Vector_base<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)spec_entries
            );
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)kOctreeTagNodeCompSpv);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&octree_tag_node_shader_module.
              super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_da0._16_8_ =
       *(undefined8 *)
        &((this->m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->m_voxel_resolution;
  spec_info.pData = local_da0 + 0x10;
  spec_entries[1].constantID = 1;
  spec_entries[1].offset = 4;
  spec_entries[1].size = 4;
  spec_entries[0].constantID = 0;
  spec_entries[0].offset = 0;
  spec_entries[0].size = 4;
  spec_info.mapEntryCount = 2;
  spec_info.dataSize = 8;
  spec_info.pMapEntries = spec_entries;
  memcpy(kOctreeTagNodeCompSpv,&DAT_0020b170,0xd60);
  myvk::ShaderModule::Create
            ((ShaderModule *)&octree_tag_node_shader_module,device,kOctreeTagNodeCompSpv,0xd60);
  myvk::ComputePipeline::Create
            ((ComputePipeline *)local_da0,this_00,
             (Ptr<ShaderModule> *)&octree_tag_node_shader_module,&spec_info);
  std::__shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_tag_node_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *)local_da0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_da0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&octree_tag_node_shader_module.
              super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  memcpy(kOctreeTagNodeCompSpv,&DAT_0020bed0,0x3f0);
  myvk::ShaderModule::Create((ShaderModule *)spec_entries,device,kOctreeTagNodeCompSpv,0x3f0);
  myvk::ComputePipeline::Create
            ((ComputePipeline *)&spec_info,this_00,(Ptr<ShaderModule> *)spec_entries,
             (VkSpecializationInfo *)0x0);
  std::__shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_init_node_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *)&spec_info);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spec_info.pMapEntries);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spec_entries[0].size);
  memcpy(kOctreeTagNodeCompSpv,&DAT_0020c2c0,0x658);
  myvk::ShaderModule::Create((ShaderModule *)spec_entries,device,kOctreeTagNodeCompSpv,0x658);
  myvk::ComputePipeline::Create
            ((ComputePipeline *)&spec_info,this_00,(Ptr<ShaderModule> *)spec_entries,
             (VkSpecializationInfo *)0x0);
  std::__shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_alloc_node_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *)&spec_info);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spec_info.pMapEntries);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spec_entries[0].size);
  memcpy(kOctreeTagNodeCompSpv,&DAT_0020c920,0x4cc);
  myvk::ShaderModule::Create((ShaderModule *)spec_entries,device,kOctreeTagNodeCompSpv,0x4cc);
  myvk::ComputePipeline::Create
            ((ComputePipeline *)&spec_info,this_00,(Ptr<ShaderModule> *)spec_entries,
             (VkSpecializationInfo *)0x0);
  std::__shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_modify_arg_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *)&spec_info);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spec_info.pMapEntries);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spec_entries[0].size);
  return;
}

Assistant:

void OctreeBuilder::create_pipeline(const std::shared_ptr<myvk::Device> &device) {
	m_pipeline_layout = myvk::PipelineLayout::Create(device, {m_descriptor_set_layout}, {});

	{
		uint32_t spec_data[] = {m_voxelizer_ptr->GetVoxelResolution(), m_voxelizer_ptr->GetVoxelFragmentCount()};
		VkSpecializationMapEntry spec_entries[] = {{0, 0, sizeof(uint32_t)}, {1, sizeof(uint32_t), sizeof(uint32_t)}};
		VkSpecializationInfo spec_info = {2, spec_entries, 2 * sizeof(uint32_t), spec_data};
		constexpr uint32_t kOctreeTagNodeCompSpv[] = {
#include "spirv/octree_tag_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_tag_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeTagNodeCompSpv, sizeof(kOctreeTagNodeCompSpv));
		m_tag_node_pipeline =
		    myvk::ComputePipeline::Create(m_pipeline_layout, octree_tag_node_shader_module, &spec_info);
	}

	{
		constexpr uint32_t kOctreeInitNodeCompSpv[] = {
#include "spirv/octree_init_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_init_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeInitNodeCompSpv, sizeof(kOctreeInitNodeCompSpv));
		m_init_node_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_init_node_shader_module);
	}

	{
		constexpr uint32_t kOctreeAllocNodeCompSpv[] = {
#include "spirv/octree_alloc_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_alloc_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeAllocNodeCompSpv, sizeof(kOctreeAllocNodeCompSpv));
		m_alloc_node_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_alloc_node_shader_module);
	}

	{
		constexpr uint32_t kOctreeModifyArgCompSpv[] = {
#include "spirv/octree_modify_arg.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_modify_arg_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeModifyArgCompSpv, sizeof(kOctreeModifyArgCompSpv));
		m_modify_arg_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_modify_arg_shader_module);
	}
}